

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

void Imf_3_4::convertInPlace(char **writePtr,char **readPtr,PixelType type,size_t numPixels)

{
  ArgExc *this;
  bool bVar1;
  
  if (type == UINT) {
    while (bVar1 = numPixels != 0, numPixels = numPixels - 1, bVar1) {
      Xdr::write<Imf_3_4::CharPtrIO,char*>(writePtr,*(uint *)*readPtr);
      *readPtr = *readPtr + 4;
    }
  }
  else if (type == HALF) {
    while (bVar1 = numPixels != 0, numPixels = numPixels - 1, bVar1) {
      Xdr::write<Imf_3_4::CharPtrIO,char*>(writePtr,(half)*(uint16_t *)*readPtr);
      *readPtr = *readPtr + 2;
    }
  }
  else {
    if (type != FLOAT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    while (bVar1 = numPixels != 0, numPixels = numPixels - 1, bVar1) {
      Xdr::write<Imf_3_4::CharPtrIO,char*>(writePtr,*(float *)*readPtr);
      *readPtr = *readPtr + 4;
    }
  }
  return;
}

Assistant:

void
convertInPlace (
    char*& writePtr, const char*& readPtr, PixelType type, size_t numPixels)
{
    switch (type)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (size_t j = 0; j < numPixels; ++j)
            {
                union bytesUintOrFloat tmp;
                tmp.b = *reinterpret_cast<const FBytes*> (readPtr);
                Xdr::write<CharPtrIO> (writePtr, tmp.u);
                readPtr += sizeof (unsigned int);
            }
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (size_t j = 0; j < numPixels; ++j)
            {
                Xdr::write<CharPtrIO> (writePtr, *(const half*) readPtr);
                readPtr += sizeof (half);
            }
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (size_t j = 0; j < numPixels; ++j)
            {
                union bytesUintOrFloat tmp;
                tmp.b = *reinterpret_cast<const FBytes*> (readPtr);
                Xdr::write<CharPtrIO> (writePtr, tmp.f);
                readPtr += sizeof (float);
            }
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}